

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_mul(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *io_1;
  TValue *io;
  lua_Integer ic;
  lua_Integer ib;
  lua_Number nc;
  lua_Number nb;
  TValue *rc_local;
  TValue *rb_local;
  TValue *ra_local;
  lua_State *L_local;
  
  if ((rb->tt_ == 0x13) && (rc->tt_ == 0x13)) {
    if (rb->tt_ != 0x13) {
      __assert_fail("((((rb))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xbff,"void raviV_op_mul(lua_State *, TValue *, TValue *, TValue *)");
    }
    if (rc->tt_ == 0x13) {
      (ra->value_).i = (rb->value_).i * (rc->value_).i;
      ra->tt_ = 0x13;
      return;
    }
    __assert_fail("((((rc))->tt_) == (((3) | ((1) << 4))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xc00,"void raviV_op_mul(lua_State *, TValue *, TValue *, TValue *)");
  }
  if (rb->tt_ == 3) {
    if (rb->tt_ != 3) {
      __assert_fail("((((rb))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xc03,"void raviV_op_mul(lua_State *, TValue *, TValue *, TValue *)");
    }
    nc = (rb->value_).n;
LAB_001657c5:
    if (rc->tt_ == 3) {
      if (rc->tt_ != 3) {
        __assert_fail("((((rc))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc03,"void raviV_op_mul(lua_State *, TValue *, TValue *, TValue *)");
      }
      ib = (rc->value_).i;
    }
    else {
      if (rc->tt_ != 0x13) goto LAB_00165894;
      if (rc->tt_ != 0x13) {
        __assert_fail("((((rc))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc03,"void raviV_op_mul(lua_State *, TValue *, TValue *, TValue *)");
      }
      ib = (lua_Integer)(double)(rc->value_).i;
    }
    (ra->value_).n = nc * (double)ib;
    ra->tt_ = 3;
  }
  else {
    if (rb->tt_ == 0x13) {
      if (rb->tt_ != 0x13) {
        __assert_fail("((((rb))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xc03,"void raviV_op_mul(lua_State *, TValue *, TValue *, TValue *)");
      }
      nc = (lua_Number)(rb->value_).i;
      goto LAB_001657c5;
    }
LAB_00165894:
    luaT_trybinTM(L,rb,rc,ra,TM_MUL);
  }
  return;
}

Assistant:

void raviV_op_mul(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Number nb;
  lua_Number nc;
  if (ttisinteger(rb) && ttisinteger(rc)) {
    lua_Integer ib = ivalue(rb);
    lua_Integer ic = ivalue(rc);
    setivalue(ra, intop(*, ib, ic));
  }
  else if (tonumberns(rb, nb) && tonumberns(rc, nc)) {
    setfltvalue(ra, luai_nummul(L, nb, nc));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_MUL);
  }
}